

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::exit(App *this,int __status)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 in_register_00000034;
  Error *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  Error *__args_1;
  App *in_stack_fffffffffffffe40;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
  *in_stack_fffffffffffffe48;
  allocator<char> *in_stack_fffffffffffffe60;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  Error local_168;
  allocator<char> local_121 [13];
  AppFormatMode in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  App *in_stack_fffffffffffffef8;
  string local_100 [87];
  allocator<char> local_a9 [33];
  string local_88 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  Error *local_18;
  App *local_10;
  
  local_18 = (Error *)CONCAT44(in_register_00000034,__status);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = this;
  Error::get_name_abi_cxx11_(in_stack_fffffffffffffe28);
  bVar1 = ::std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
  if (bVar1) {
    Error::get_exit_code(local_18);
  }
  else {
    Error::get_name_abi_cxx11_(in_stack_fffffffffffffe28);
    bVar1 = ::std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (local_20,(char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      help(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      ::std::operator<<((ostream *)local_20,local_88);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
      ::std::allocator<char>::~allocator(local_a9);
      Error::get_exit_code(local_18);
    }
    else {
      Error::get_name_abi_cxx11_(in_stack_fffffffffffffe28);
      bVar2 = ::std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
      if ((bVar2 & 1) == 0) {
        Error::get_name_abi_cxx11_(in_stack_fffffffffffffe28);
        bVar1 = ::std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
        if (bVar1) {
          pcVar4 = (char *)(**(code **)(*(long *)local_18 + 0x10))();
          poVar5 = ::std::operator<<((ostream *)local_20,pcVar4);
          ::std::operator<<(poVar5,'\n');
          Error::get_exit_code(local_18);
        }
        else {
          iVar3 = Error::get_exit_code(local_18);
          if ((iVar3 != 0) &&
             (bVar1 = ::std::function::operator_cast_to_bool
                                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
                                  *)0x1d072b), bVar1)) {
            __args_1 = &local_168;
            std::
            function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
            ::operator()(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,__args_1);
            poVar5 = ::std::operator<<((ostream *)local_28,(string *)__args_1);
            ::std::ostream::operator<<(poVar5,::std::flush<char,std::char_traits<char>>);
            ::std::__cxx11::string::~string(local_28);
          }
          Error::get_exit_code(local_18);
        }
      }
      else {
        __a = local_121;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe70,(char *)CONCAT17(bVar2,in_stack_fffffffffffffe68),__a);
        help(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        ::std::operator<<((ostream *)local_20,local_100);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffe30);
        ::std::allocator<char>::~allocator((allocator<char> *)local_121);
        Error::get_exit_code(local_18);
      }
    }
  }
  return;
}

Assistant:

CLI11_INLINE int App::exit(const Error &e, std::ostream &out, std::ostream &err) const {

    /// Avoid printing anything if this is a CLI::RuntimeError
    if(e.get_name() == "RuntimeError")
        return e.get_exit_code();

    if(e.get_name() == "CallForHelp") {
        out << help();
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForAllHelp") {
        out << help("", AppFormatMode::All);
        return e.get_exit_code();
    }

    if(e.get_name() == "CallForVersion") {
        out << e.what() << '\n';
        return e.get_exit_code();
    }

    if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
        if(failure_message_)
            err << failure_message_(this, e) << std::flush;
    }

    return e.get_exit_code();
}